

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::BRK_IP(CPU *this)

{
  int iVar1;
  uint uVar2;
  
  this->cycles = 7;
  WriteWordToStack(this,this->pc);
  (*this->memory->_vptr_MemoryBus[3])
            (this->memory,(ulong)(this->sp | 0x100),(ulong)(this->field_6).ps);
  this->sp = this->sp + 0xff;
  this->cycles = this->cycles - 3;
  iVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,0xfffe);
  this->cycles = this->cycles - 1;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,0xffff);
  this->pc = (ushort)((uVar2 & 0xff) << 8) | (ushort)iVar1 & 0xff;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps | 0x20;
  return;
}

Assistant:

void CPU::BRK_IP()
{
    cycles = 7;
    WriteWordToStack(pc);
    WriteByteToStack(ps);
    pc = ReadWord(0xFFFE);
    cycles--;
    B = 1;
}